

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<const_void_*const_&> __thiscall
kj::Table<void_const*,kj::HashIndex<kj::_::HashSetCallbacks>>::find<0ul,void_const*&>
          (Table<void_const*,kj::HashIndex<kj::_::HashSetCallbacks>> *this,Entry *params)

{
  String *pSVar1;
  char **ppcVar2;
  ArrayPtr<const_void_*const> table;
  char local_28;
  size_t local_20;
  
  table.ptr = &(params->value).dir.ptr;
  pSVar1 = (params->key).parts.ptr;
  table.size_ = (size_t)pSVar1;
  HashIndex<kj::_::HashSetCallbacks>::find<void_const*const,void_const*&>
            ((HashIndex<kj::_::HashSetCallbacks> *)&local_28,table,
             (Entry *)((long)((params->key).parts.size_ - (long)pSVar1) >> 3));
  if (local_28 == '\x01') {
    ppcVar2 = &(((params->key).parts.ptr)->content).ptr + local_20;
  }
  else {
    ppcVar2 = (char **)0x0;
  }
  *(char ***)this = ppcVar2;
  return (Maybe<const_void_*const_&>)(Entry *)this;
}

Assistant:

kj::Maybe<const Row&> Table<Row, Indexes...>::find(Params&&... params) const {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}